

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Type TVar5;
  Type TVar6;
  UnknownField *pUVar7;
  reference ppFVar8;
  LogMessage *this_00;
  OptionInterpreter *in_RCX;
  const_iterator in_RDX;
  const_iterator in_RDI;
  FieldDescriptor *in_R8;
  string *in_R9;
  UnknownFieldSet intermediate_unknown_fields;
  Type type;
  UnknownField *unknown_field;
  int i_1;
  int i;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  OptionInterpreter *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  LogMessage *in_stack_fffffffffffffe90;
  byte local_152;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined1 local_118 [36];
  int in_stack_ffffffffffffff0c;
  LogMessage *in_stack_ffffffffffffff10;
  int local_90;
  string local_80 [32];
  string local_60 [32];
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_10;
  byte local_1;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                      *)in_stack_fffffffffffffe80,
                     (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (bVar1) {
    iVar4 = 0;
    while (iVar3 = iVar4, iVar2 = UnknownFieldSet::field_count((UnknownFieldSet *)0x4b17a5),
          iVar4 < iVar2) {
      pUVar7 = UnknownFieldSet::field
                         ((UnknownFieldSet *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      iVar4 = UnknownField::number(pUVar7);
      iVar2 = FieldDescriptor::number((FieldDescriptor *)in_RCX);
      if (iVar4 == iVar2) {
        std::operator+((char *)local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
        local_1 = AddNameError(in_stack_fffffffffffffe80,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::__cxx11::string::~string(local_60);
        std::__cxx11::string::~string(local_80);
        goto LAB_004b1c50;
      }
      iVar4 = iVar3 + 1;
    }
    local_1 = 1;
  }
  else {
    local_90 = 0;
    while (iVar4 = local_90, iVar3 = UnknownFieldSet::field_count((UnknownFieldSet *)0x4b18ff),
          iVar4 < iVar3) {
      pUVar7 = UnknownFieldSet::field
                         ((UnknownFieldSet *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      iVar4 = UnknownField::number(pUVar7);
      ppFVar8 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&local_10);
      iVar3 = FieldDescriptor::number(*ppFVar8);
      if (iVar4 == iVar3) {
        pUVar7 = UnknownFieldSet::field
                           ((UnknownFieldSet *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator*(&local_10);
        TVar5 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffe90);
        if (TVar5 == TYPE_GROUP) {
          TVar6 = UnknownField::type(pUVar7);
          if (TVar6 == TYPE_GROUP) {
            __gnu_cxx::
            __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
            ::operator+((__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                         *)in_stack_fffffffffffffe88,(difference_type)in_stack_fffffffffffffe80);
            UnknownField::group(pUVar7);
            bVar1 = ExamineIfOptionIsSet
                              (in_RCX,in_RDX,in_RDI,in_R8,in_R9,
                               (UnknownFieldSet *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              local_1 = 0;
              goto LAB_004b1c50;
            }
          }
        }
        else {
          if (TVar5 != TYPE_MESSAGE) {
            internal::LogMessage::LogMessage
                      (in_stack_fffffffffffffe90,(LogLevel_conflict)((ulong)local_118 >> 0x20),
                       (char *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            internal::LogMessage::operator<<
                      ((LogMessage *)in_stack_fffffffffffffe80,
                       (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            this_00 = internal::LogMessage::operator<<
                                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
            internal::LogFinisher::operator=
                      ((LogFinisher *)this_00,
                       (LogMessage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            internal::LogMessage::~LogMessage((LogMessage *)0x4b1c04);
            local_1 = 0;
            goto LAB_004b1c50;
          }
          TVar6 = UnknownField::type(pUVar7);
          if (TVar6 == TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)0x4b19d0);
            UnknownField::length_delimited_abi_cxx11_(pUVar7);
            bVar1 = UnknownFieldSet::ParseFromString
                              ((UnknownFieldSet *)in_stack_fffffffffffffe90,
                               in_stack_fffffffffffffe88);
            local_152 = 0;
            if (bVar1) {
              __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator+((__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                           *)in_stack_fffffffffffffe88,(difference_type)in_stack_fffffffffffffe80);
              bVar1 = ExamineIfOptionIsSet
                                (in_RCX,in_RDX,in_RDI,in_R8,in_R9,
                                 (UnknownFieldSet *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
              local_152 = bVar1 ^ 0xff;
            }
            bVar1 = (local_152 & 1) != 0;
            if (bVar1) {
              local_1 = 0;
            }
            UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)in_stack_fffffffffffffe80);
            if (bVar1) goto LAB_004b1c50;
          }
        }
      }
      local_90 = local_90 + 1;
    }
    local_1 = 1;
  }
LAB_004b1c50:
  return (bool)(local_1 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}